

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  char *pcVar5;
  char **ppcVar6;
  char **in_RSI;
  int in_EDI;
  quicly_stream_t *stream;
  int ret_1;
  quicly_conn_t *client;
  sockaddr_in local;
  int reuseaddr;
  EVP_PKEY *pkey;
  FILE *fp;
  int ret;
  int fd;
  int ch;
  socklen_t salen;
  sockaddr_storage sa;
  char *port;
  char *host;
  quicly_stream_open_t stream_open;
  ptls_context_t tlsctx;
  ptls_openssl_sign_certificate_t sign_certificate;
  char *in_stack_fffffffffffffdd8;
  ptls_context_t *in_stack_fffffffffffffde0;
  EVP_PKEY *in_stack_fffffffffffffdf0;
  ptls_openssl_sign_certificate_t *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe08;
  char *pcVar7;
  int uni;
  quicly_stream_t **in_stack_fffffffffffffe10;
  quicly_conn_t *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe38;
  quicly_conn_t *client_00;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  socklen_t *in_stack_fffffffffffffe50;
  sockaddr *in_stack_fffffffffffffe58;
  undefined4 local_19c;
  EVP_PKEY *local_198;
  FILE *in_stack_fffffffffffffe70;
  socklen_t local_17c;
  sockaddr local_178 [8];
  char *local_f8;
  char *local_f0;
  quicly_stream_open_t local_e8;
  undefined1 local_e0 [24];
  quicly_cid_plaintext_t *in_stack_ffffffffffffff38;
  ptls_iovec_t *in_stack_ffffffffffffff40;
  sockaddr *in_stack_ffffffffffffff48;
  ptls_esni_context_t **in_stack_ffffffffffffff50;
  quicly_context_t *in_stack_ffffffffffffff58;
  ptls_emit_certificate_t *in_stack_ffffffffffffff60;
  ptls_sign_certificate_t *local_98;
  ptls_iovec_t in_stack_ffffffffffffff70;
  ptls_handshake_properties_t *in_stack_ffffffffffffff80;
  quicly_transport_parameters_t *in_stack_ffffffffffffff88;
  ptls_sign_certificate_t local_28 [3];
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memcpy(local_e0,&PTR_ptls_openssl_random_bytes_0015f600,0xb8);
  local_e8.cb = on_stream_open;
  local_f0 = "127.0.0.1";
  local_f8 = "4433";
  memcpy(&ctx,&quicly_spec_context,0x100);
  ctx.tls = (ptls_context_t *)local_e0;
  quicly_amend_ptls_context(ctx.tls);
  ctx.stream_open = &local_e8;
  do {
    iVar1 = getopt(local_8,local_10,"c:k:p:h");
    uni = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    if (iVar1 == -1) {
      if ((in_stack_ffffffffffffff48 != (sockaddr *)0x0) !=
          (local_98 != (ptls_sign_certificate_t *)0x0)) {
        fprintf(_stderr,"-c and -k options must be used together\n");
        exit(1);
      }
      local_8 = local_8 - _optind;
      ppcVar6 = local_10 + _optind;
      local_10 = ppcVar6;
      if (local_8 != 0) {
        local_10 = ppcVar6 + 1;
        local_f0 = *ppcVar6;
      }
      iVar1 = resolve_address(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                              (int)in_stack_fffffffffffffe38,(int)in_stack_fffffffffffffe70);
      if (iVar1 != 0) {
        exit(1);
      }
      iVar1 = socket((uint)local_178[0].sa_family,2,0);
      if (iVar1 == -1) {
        perror("socket(2) failed");
        exit(1);
      }
      iVar2 = is_server();
      if (iVar2 == 0) {
        memset(&stack0xfffffffffffffe48,0,0x10);
        iVar2 = bind(iVar1,(sockaddr *)&stack0xfffffffffffffe48,0x10);
        if (iVar2 != 0) {
          perror("bind(2) failed");
          exit(1);
        }
      }
      else {
        local_19c = 1;
        setsockopt(iVar1,1,2,&local_19c,4);
        iVar2 = bind(iVar1,local_178,local_17c);
        if (iVar2 != 0) {
          perror("bind(2) failed");
          exit(1);
        }
      }
      client_00 = (quicly_conn_t *)0x0;
      iVar2 = is_server();
      if (iVar2 == 0) {
        ptls_iovec_init((void *)0x0,0);
        uVar3 = quicly_connect((quicly_conn_t **)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                               ,(char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                               (sockaddr *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                               in_stack_ffffffffffffff70,in_stack_ffffffffffffff80,
                               in_stack_ffffffffffffff88);
        if (uVar3 != 0) {
          fprintf(_stderr,"quicly_connect failed:%d\n",(ulong)uVar3);
          exit(1);
        }
        quicly_open_stream(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,uni);
      }
      iVar1 = run_loop(iVar1,client_00);
      return iVar1;
    }
    in_stack_fffffffffffffe10 = (quicly_stream_t **)(ulong)(iVar1 - 99);
    switch(in_stack_fffffffffffffe10) {
    case (quicly_stream_t **)0x0:
      uVar3 = ptls_load_certificates(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      if (uVar3 != 0) {
        fprintf(_stderr,"failed to load certificates from file %s:%d\n",_optarg,(ulong)uVar3);
        exit(1);
      }
      break;
    default:
      exit(1);
    case (quicly_stream_t **)0x5:
      usage((char *)0x12bb3c);
      break;
    case (quicly_stream_t **)0x8:
      in_stack_fffffffffffffe70 = fopen(_optarg,"r");
      __stream = _stderr;
      if (in_stack_fffffffffffffe70 == (FILE *)0x0) {
        pcVar7 = _optarg;
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(__stream,"failed to open file:%s:%s\n",pcVar7,pcVar5);
        exit(1);
      }
      local_198 = PEM_read_PrivateKey(in_stack_fffffffffffffe70,(EVP_PKEY **)0x0,(undefined1 *)0x0,
                                      (void *)0x0);
      fclose(in_stack_fffffffffffffe70);
      if (local_198 == (EVP_PKEY *)0x0) {
        fprintf(_stderr,"failed to load private key from file:%s\n",_optarg);
        exit(1);
      }
      ptls_openssl_init_sign_certificate(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      EVP_PKEY_free(local_198);
      local_98 = local_28;
      break;
    case (quicly_stream_t **)0xd:
      local_f8 = _optarg;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    ptls_openssl_sign_certificate_t sign_certificate;
    ptls_context_t tlsctx = {
        .random_bytes = ptls_openssl_random_bytes,
        .get_time = &ptls_get_time,
        .key_exchanges = ptls_openssl_key_exchanges,
        .cipher_suites = ptls_openssl_cipher_suites,
    };
    quicly_stream_open_t stream_open = {on_stream_open};
    char *host = "127.0.0.1", *port = "4433";
    struct sockaddr_storage sa;
    socklen_t salen;
    int ch, fd;

    /* setup quic context */
    ctx = quicly_spec_context;
    ctx.tls = &tlsctx;
    quicly_amend_ptls_context(ctx.tls);
    ctx.stream_open = &stream_open;

    /* resolve command line options and arguments */
    while ((ch = getopt(argc, argv, "c:k:p:h")) != -1) {
        switch (ch) {
        case 'c': /* load certificate chain */ {
            int ret;
            if ((ret = ptls_load_certificates(&tlsctx, optarg)) != 0) {
                fprintf(stderr, "failed to load certificates from file %s:%d\n", optarg, ret);
                exit(1);
            }
        } break;
        case 'k': /* load private key */ {
            FILE *fp;
            if ((fp = fopen(optarg, "r")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            EVP_PKEY *pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL);
            fclose(fp);
            if (pkey == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                exit(1);
            }
            ptls_openssl_init_sign_certificate(&sign_certificate, pkey);
            EVP_PKEY_free(pkey);
            tlsctx.sign_certificate = &sign_certificate.super;
        } break;
        case 'p': /* port */
            port = optarg;
            break;
        case 'h': /* help */
            usage(argv[0]);
            break;
        default:
            exit(1);
            break;
        }
    }
    if ((tlsctx.certificates.count != 0) != (tlsctx.sign_certificate != NULL)) {
        fprintf(stderr, "-c and -k options must be used together\n");
        exit(1);
    }
    argc -= optind;
    argv += optind;
    if (argc != 0)
        host = *argv++;
    if (resolve_address((struct sockaddr *)&sa, &salen, host, port, AF_INET, SOCK_DGRAM, 0) != 0)
        exit(1);

    /* open socket, on the specified port (as a server), or on any port (as a client) */
    if ((fd = socket(sa.ss_family, SOCK_DGRAM, 0)) == -1) {
        perror("socket(2) failed");
        exit(1);
    }
    // fcntl(fd, F_SETFL, O_NONBLOCK);
    if (is_server()) {
        int reuseaddr = 1;
        setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &reuseaddr, sizeof(reuseaddr));
        if (bind(fd, (struct sockaddr *)&sa, salen) != 0) {
            perror("bind(2) failed");
            exit(1);
        }
    } else {
        struct sockaddr_in local;
        memset(&local, 0, sizeof(local));
        if (bind(fd, (struct sockaddr *)&local, sizeof(local)) != 0) {
            perror("bind(2) failed");
            exit(1);
        }
    }

    quicly_conn_t *client = NULL;
    if (!is_server()) {
        /* initiate a connection, and open a stream */
        int ret;
        if ((ret = quicly_connect(&client, &ctx, host, (struct sockaddr *)&sa, NULL, &next_cid, ptls_iovec_init(NULL, 0), NULL,
                                  NULL)) != 0) {
            fprintf(stderr, "quicly_connect failed:%d\n", ret);
            exit(1);
        }
        quicly_stream_t *stream; /* we retain the opened stream via the on_stream_open callback */
        quicly_open_stream(client, &stream, 0);
    }

    /* enter the event loop with a connection object */
    return run_loop(fd, client);
}